

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall lest::expected::expected(expected *this,location *where_,text *expr_,text *excpt_)

{
  allocator local_d1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  char local_c0 [8];
  undefined8 uStack_b8;
  text local_b0;
  text local_90;
  text local_70;
  location local_50;
  
  std::__cxx11::string::string((string *)&local_d0,"failed: didn\'t get exception",&local_d1);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  if (local_d0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0) {
    local_b0.field_2._8_8_ = uStack_b8;
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)local_d0;
  }
  local_b0._M_string_length = local_c8;
  local_c8 = 0;
  local_c0[0] = '\0';
  local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_c0;
  location::location(&local_50,where_);
  std::__cxx11::string::string((string *)&local_70,(string *)expr_);
  std::__cxx11::string::string((string *)&local_90,(string *)excpt_);
  message::message(&this->super_message,&local_b0,&local_50,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  *(undefined ***)&this->super_message = &PTR__message_001b1c18;
  return;
}

Assistant:

expected( location where_, text expr_, text excpt_ = "" )
    : message( "failed: didn't get exception", where_, expr_, excpt_) {}